

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void cmDependsFortranParser_RuleElse(cmDependsFortranParser *parser)

{
  bool bVar1;
  reference pvVar2;
  cmDependsFortranParser *parser_local;
  
  if (parser->InPPFalseBranch < 2) {
    bVar1 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::empty(&parser->SkipToEnd);
    if ((bVar1) ||
       (pvVar2 = std::stack<bool,_std::deque<bool,_std::allocator<bool>_>_>::top(&parser->SkipToEnd)
       , (*pvVar2 & 1U) == 0)) {
      parser->InPPFalseBranch = 0;
    }
    else {
      parser->InPPFalseBranch = 1;
    }
  }
  return;
}

Assistant:

void cmDependsFortranParser_RuleElse(cmDependsFortranParser* parser)
{
  // if the parent branch is false do nothing!
  if(parser->InPPFalseBranch > 1)
    {
    return;
    }

  // parser->InPPFalseBranch is either 0 or 1.  We change it depending on
  // parser->SkipToEnd.top()
  if(!parser->SkipToEnd.empty() &&
     parser->SkipToEnd.top())
    {
    parser->InPPFalseBranch = 1;
    }
  else
    {
    parser->InPPFalseBranch = 0;
    }
}